

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationsTest::executeDrawCall
          (VertexAttribLocationsTest *this,GLuint test_case_index)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  Functions *gl;
  GLuint test_case_index_local;
  VertexAttribLocationsTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  switch(test_case_index) {
  case 0:
    (**(code **)(lVar4 + 0x538))(0xe,0,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x307f);
    break;
  case 1:
    (**(code **)(lVar4 + 0x548))(0xe,0,1,4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawArraysInstanced",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x3083);
    break;
  case 2:
    (**(code **)(lVar4 + 0x568))(0xe,1,0x1401,"");
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawElements",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x3087);
    break;
  case 3:
    (**(code **)(lVar4 + 0x570))(0xe,1,0x1401,"",4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawElementsBaseVertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x308b);
    break;
  case 4:
    (**(code **)(lVar4 + 0x580))(0xe,1,0x1401,"",4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawElementsInstanced",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x308f);
    break;
  case 5:
    (**(code **)(lVar4 + 0x588))(0xe,1,0x1401,"",4,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawElementsInstancedBaseInstance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x3094);
    break;
  case 6:
    (**(code **)(lVar4 + 0x590))(0xe,1,0x1401,"",4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawElementsInstancedBaseVertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x3099);
    break;
  case 7:
    (**(code **)(lVar4 + 0x598))(0xe,1,0x1401,"",4,4,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawElementsInstancedBaseVertexBaseInstance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x309e);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x30a1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void VertexAttribLocationsTest::executeDrawCall(GLuint test_case_index)
{
	static const GLubyte indices[8] = { 0 };

	const Functions& gl = m_context.getRenderContext().getFunctions();

	switch (test_case_index)
	{
	case DRAWARRAYS:
		gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");
		break;
	case DRAWARRAYSINSTANCED:
		gl.drawArraysInstanced(GL_PATCHES, 0 /* first */, 1 /* count */, m_n_instances);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArraysInstanced");
		break;
	case DRAWELEMENTS:
		gl.drawElements(GL_PATCHES, 1 /* count */, GL_UNSIGNED_BYTE, indices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements");
		break;
	case DRAWELEMENTSBASEVERTEX:
		gl.drawElementsBaseVertex(GL_PATCHES, 1 /* count */, GL_UNSIGNED_BYTE, indices, m_base_vertex);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElementsBaseVertex");
		break;
	case DRAWELEMENTSINSTANCED:
		gl.drawElementsInstanced(GL_PATCHES, 1 /* count */, GL_UNSIGNED_BYTE, indices, m_n_instances);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElementsInstanced");
		break;
	case DRAWELEMENTSINSTANCEDBASEINSTANCE:
		gl.drawElementsInstancedBaseInstance(GL_PATCHES, 1 /* count */, GL_UNSIGNED_BYTE, indices, m_n_instances,
											 m_base_instance);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElementsInstancedBaseInstance");
		break;
	case DRAWELEMENTSINSTANCEDBASEVERTEX:
		gl.drawElementsInstancedBaseVertex(GL_PATCHES, 1 /* count */, GL_UNSIGNED_BYTE, indices, m_n_instances,
										   m_base_vertex);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElementsInstancedBaseVertex");
		break;
	case DRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE:
		gl.drawElementsInstancedBaseVertexBaseInstance(GL_PATCHES, 1 /* count */, GL_UNSIGNED_BYTE, indices,
													   m_n_instances, m_base_vertex, m_base_instance);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElementsInstancedBaseVertexBaseInstance");
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}